

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O2

void rngRekey(void)

{
  mtMtxLock(_mtx);
  brngCTRStepR(_state,0x20,_state + 1);
  brngCTRStart(_state + 1,_state->block,(octet *)0x0);
  memWipe(_state,0x20);
  mtMtxUnlock(_mtx);
  return;
}

Assistant:

void rngRekey()
{
	// блокировать мьютекс
	ASSERT(_inited);
	mtMtxLock(_mtx);
	// сгенерировать новый ключ
	ASSERT(rngIsValid_internal());
	brngCTRStepR(_state->block, 32, _state->alg_state);
	// пересоздать brngCTR
	brngCTRStart(_state->alg_state, _state->block, 0);
	memWipe(_state->block, 32);
	// снять блокировку
	mtMtxUnlock(_mtx);
}